

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFileEqnStorage.cpp
# Opt level: O2

void __thiscall TPZFileEqnStorage<double>::Zero(TPZFileEqnStorage<double> *this)

{
  uint in_EAX;
  int __fd;
  ostream *poVar1;
  FILE *__s;
  uint uStack_38;
  int zero;
  
  uStack_38 = in_EAX;
  if (this->fIOStream != (FILE *)0x0) {
    FinishWriting(this);
  }
  remove((this->fFileName)._M_dataplus._M_p);
  builtin_strncpy(filenamestorage,"/tmp/binary_frontalXXXXXX",0x1a);
  __fd = mkstemp(filenamestorage);
  poVar1 = std::operator<<((ostream *)&std::cout,"Temporary file name ");
  poVar1 = std::operator<<(poVar1,filenamestorage);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::ostream::flush();
  TPZManVector<long,_10>::Resize(&(this->fBlockPos).super_TPZManVector<long,_10>,0);
  this->fNumBlocks = 0;
  this->fCurrentBlock = 0;
  this->fCurBlockPosition = -1;
  this->fNumHeaders = 0x14;
  std::__cxx11::string::assign((char *)&this->fFileName);
  __s = fdopen(__fd,"wb");
  this->fIOStream = (FILE *)__s;
  _uStack_38 = (ulong)uStack_38;
  fwrite(&this->fNumHeaders,4,1,__s);
  fwrite(&zero,4,1,(FILE *)this->fIOStream);
  return;
}

Assistant:

void TPZFileEqnStorage<TVar>::Zero()
{
	if(fIOStream) FinishWriting();
	remove(fFileName.c_str());
	
	strcpy(filenamestorage, "/tmp/binary_frontalXXXXXX");
	
	int fdtmp = -1;
#ifdef WIN32
	_mktemp(filenamestorage);
#else
	fdtmp = mkstemp(filenamestorage); //returns file description for tmp file
#endif
	cout << "Temporary file name " << filenamestorage << endl;
	cout.flush();
	
	fBlockPos.Resize(0);
	fCurBlockPosition = -1;
	fNumBlocks=0;
	fCurrentBlock=0;
	fNumHeaders=20;
	
	fFileName = filenamestorage;
#ifdef WIN32
	fIOStream = fopen(filenamestorage,"wb"); //open for writing
#else
	fIOStream = fdopen(fdtmp,"wb"); //open for writing
#endif
	/**
	 *Writes NumHeaders and NumBlocks information in
	 *the two initial positions on fIOStream
	 */
	int zero = 0;
	fwrite(&fNumHeaders,sizeof(int),1,fIOStream);
	fwrite(&zero,sizeof(int),1,fIOStream);
}